

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__true(ColladaParserAutoGen15Private *this)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__true()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__true();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}